

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::hex_writer::operator()
          (hex_writer *this,truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it
          )

{
  undefined8 *in_RSI;
  undefined8 in_RDI;
  unsigned_long unaff_retaddr;
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> in_stack_00000010;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_18;
  
  internal::
  format_uint<4u,wchar_t,fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,unsigned_long>
            (in_stack_00000010,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  *in_RSI = local_30;
  in_RSI[1] = local_28;
  in_RSI[2] = local_20;
  *(undefined4 *)(in_RSI + 3) = local_18;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<4, char_type>(
              it, self.abs_value, num_digits, self.spec.type != 'x');
      }